

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O3

void enterBlock(vm *v,byte op_code,func_type bt,vec *instructions)

{
  control_frame *pcVar1;
  long lVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  byte bVar5;
  control_frame cf;
  control_frame in_stack_ffffffffffffff68;
  byte local_50 [8];
  vec *local_48;
  undefined8 local_40;
  byte *pbStack_38;
  uint32 local_30;
  undefined4 uStack_2c;
  byte *pbStack_28;
  long local_20;
  undefined8 local_18;
  int local_10;
  
  bVar5 = 0;
  local_50[0] = op_code;
  local_48 = instructions;
  local_40 = bt._0_8_;
  pbStack_38 = bt.param_types;
  local_30 = bt.return_count;
  uStack_2c = bt._20_4_;
  pbStack_28 = bt.return_types;
  local_20 = (v->operandStack).size - (ulong)bt.param_count;
  local_18 = 0;
  local_10 = 0;
  if ((byte)(op_code - 2) < 3) {
    pcVar1 = get_top_control_stack_ele_p(&v->controlStack);
    local_10 = pcVar1->depth + 1;
  }
  pbVar3 = local_50;
  puVar4 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pbVar3;
    pbVar3 = pbVar3 + ((ulong)bVar5 * -2 + 1) * 8;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  push_control_stack(&v->controlStack,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void enterBlock(vm *v, byte op_code, func_type bt, vec *instructions) {
    control_frame cf = {
            .opcode = op_code,
            .instructions = instructions,
            .block_type = bt,
            .bp = v->operandStack.size - bt.param_count,
            .pc = 0,
            .depth=0
    };
    if (cf.opcode == Block || cf.opcode == Loop || cf.opcode == If) {
        cf.depth = get_top_control_stack_ele_p(&v->controlStack)->depth + 1;
    }
    push_control_stack(&v->controlStack, cf);
}